

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,REF_DBL *max_error)

{
  REF_MPI pRVar1;
  REF_NODE pRVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_GLOB *pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  uint uVar8;
  void *pvVar9;
  void *send;
  REF_INT *pRVar10;
  REF_INT *proc;
  int iVar11;
  undefined8 uVar12;
  size_t __size;
  long lVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  REF_INT n_recept;
  REF_INT n_donor;
  REF_MPI local_108;
  void *local_100;
  REF_INT *recept_node;
  REF_DBL *max_error_local;
  REF_INT *donor_ret;
  REF_CELL local_e0;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_xyz;
  REF_DBL error;
  REF_NODE local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_interp->ref_mpi;
  pRVar2 = ref_interp->to_grid->node;
  pRVar3 = ref_interp->from_grid->node;
  pRVar4 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  *max_error = 0.0;
  n_recept = 0;
  if (0 < (long)pRVar2->max) {
    iVar11 = 0;
    lVar13 = 0;
    do {
      if (((-1 < pRVar2->global[lVar13]) && (pRVar2->ref_mpi->id == pRVar2->part[lVar13])) &&
         (ref_interp->cell[lVar13] != -1)) {
        iVar11 = iVar11 + 1;
        n_recept = iVar11;
      }
      lVar13 = lVar13 + 1;
    } while (pRVar2->max != lVar13);
  }
  lVar13 = (long)n_recept;
  max_error_local = max_error;
  if (lVar13 < 0) {
    pcVar15 = "malloc recept_bary of REF_DBL negative";
    uVar12 = 0x956;
LAB_00173861:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12
           ,"ref_interp_max_error",pcVar15);
    return 1;
  }
  local_108 = pRVar1;
  pvVar9 = malloc((ulong)(uint)(n_recept * 4) << 3);
  if (pvVar9 == (void *)0x0) {
    pcVar15 = "malloc recept_bary of REF_DBL NULL";
    uVar12 = 0x956;
  }
  else {
    __size = lVar13 << 2;
    local_e0 = pRVar4;
    local_b0 = pRVar3;
    send = malloc(__size);
    if (send == (void *)0x0) {
      pcVar15 = "malloc recept_cell of REF_INT NULL";
      uVar12 = 0x957;
    }
    else {
      pRVar10 = (REF_INT *)malloc(__size);
      recept_node = pRVar10;
      if (pRVar10 == (REF_INT *)0x0) {
        pcVar15 = "malloc recept_node of REF_INT NULL";
        uVar12 = 0x958;
      }
      else {
        local_100 = malloc(__size);
        if (local_100 == (void *)0x0) {
          pcVar15 = "malloc recept_ret of REF_INT NULL";
          uVar12 = 0x959;
        }
        else {
          proc = (REF_INT *)malloc(__size);
          pRVar1 = local_108;
          if (proc != (REF_INT *)0x0) {
            n_recept = 0;
            if (0 < pRVar2->max) {
              iVar11 = 0;
              pRVar5 = pRVar2->global;
              lVar13 = 0;
              lVar14 = 0;
              do {
                if (((-1 < pRVar5[lVar14]) && (pRVar2->ref_mpi->id == pRVar2->part[lVar14])) &&
                   (pRVar6 = ref_interp->cell, pRVar6[lVar14] != -1)) {
                  pRVar7 = ref_interp->bary;
                  lVar17 = 0;
                  do {
                    *(undefined8 *)((long)pvVar9 + lVar17 * 8 + (long)(iVar11 * 4) * 8) =
                         *(undefined8 *)((long)pRVar7 + lVar17 * 8 + lVar13);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 4);
                  lVar17 = (long)iVar11;
                  proc[lVar17] = ref_interp->part[lVar14];
                  *(REF_INT *)((long)send + lVar17 * 4) = pRVar6[lVar14];
                  pRVar10[lVar17] = (REF_INT)lVar14;
                  *(REF_INT *)((long)local_100 + lVar17 * 4) = local_108->id;
                  iVar11 = iVar11 + 1;
                  n_recept = iVar11;
                }
                lVar14 = lVar14 + 1;
                lVar13 = lVar13 + 0x20;
              } while (lVar14 < pRVar2->max);
            }
            uVar8 = ref_mpi_blindsend(local_108,proc,send,1,n_recept,&donor_cell,&n_donor,1);
            if (uVar8 == 0) {
              uVar8 = ref_mpi_blindsend(pRVar1,proc,local_100,1,n_recept,&donor_ret,&n_donor,1);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x96f,"ref_interp_max_error",(ulong)uVar8,"blind send ret");
                return uVar8;
              }
              uVar8 = ref_mpi_blindsend(local_108,proc,recept_node,1,n_recept,&donor_node,&n_donor,1
                                       );
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x972,"ref_interp_max_error",(ulong)uVar8,"blind send node");
                return uVar8;
              }
              uVar8 = ref_mpi_blindsend(local_108,proc,pvVar9,4,n_recept,&donor_bary,&n_donor,3);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x975,"ref_interp_max_error",(ulong)uVar8);
                return uVar8;
              }
              free(proc);
              free(local_100);
              if (recept_node != (REF_INT *)0x0) {
                free(recept_node);
              }
              free(send);
              free(pvVar9);
              if (n_donor < 0) {
                pcVar15 = "malloc donor_xyz of REF_DBL negative";
                uVar12 = 0x97d;
                goto LAB_00173861;
              }
              pvVar9 = malloc((ulong)(uint)n_donor * 0x18);
              if (pvVar9 == (void *)0x0) {
                pcVar15 = "malloc donor_xyz of REF_DBL NULL";
                uVar12 = 0x97d;
                goto LAB_00173922;
              }
              if (0 < n_donor) {
                lVar13 = 0;
                do {
                  uVar8 = ref_cell_nodes(local_e0,donor_cell[lVar13],nodes);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x981,"ref_interp_max_error",(ulong)uVar8);
                    return uVar8;
                  }
                  uVar8 = local_e0->node_per;
                  lVar14 = 0;
                  do {
                    *(undefined8 *)((long)pvVar9 + lVar14 * 8 + lVar13 * 0x18) = 0;
                    if (0 < (int)uVar8) {
                      pRVar7 = local_b0->real;
                      dVar18 = *(double *)((long)pvVar9 + lVar14 * 8 + lVar13 * 0x18);
                      uVar16 = 0;
                      do {
                        dVar18 = dVar18 + donor_bary
                                          [(ulong)((uint)lVar13 & 0x3fffffff) * 4 + uVar16] *
                                          pRVar7[(long)nodes[uVar16] * 0xf + (long)(int)lVar14];
                        *(double *)((long)pvVar9 + lVar14 * 8 + lVar13 * 0x18) = dVar18;
                        uVar16 = uVar16 + 1;
                      } while (uVar8 != uVar16);
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  lVar13 = lVar13 + 1;
                } while (lVar13 < n_donor);
              }
              if (donor_cell != (REF_INT *)0x0) {
                free(donor_cell);
              }
              if (donor_bary != (REF_DBL *)0x0) {
                free(donor_bary);
              }
              uVar8 = ref_mpi_blindsend(local_108,donor_ret,pvVar9,3,n_donor,&recept_xyz,&n_recept,3
                                       );
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x98f,"ref_interp_max_error",(ulong)uVar8,"blind send bary");
                return uVar8;
              }
              uVar8 = ref_mpi_blindsend(local_108,donor_ret,donor_node,1,n_donor,&recept_node,
                                        &n_recept,1);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x992,"ref_interp_max_error",(ulong)uVar8,"blind send node");
                return uVar8;
              }
              free(pvVar9);
              if (donor_node != (REF_INT *)0x0) {
                free(donor_node);
              }
              if (donor_ret != (REF_INT *)0x0) {
                free(donor_ret);
              }
              if (0 < n_recept) {
                lVar13 = 4;
                lVar14 = 0;
                do {
                  lVar17 = (long)recept_node[lVar14];
                  pRVar7 = pRVar2->real;
                  dVar19 = *(double *)((long)recept_xyz + lVar13 * 4 + -0x10) - pRVar7[lVar17 * 0xf]
                  ;
                  dVar20 = *(double *)((long)recept_xyz + lVar13 * 4 + -8) -
                           pRVar7[lVar17 * 0xf + 1];
                  dVar18 = *(double *)((long)recept_xyz + lVar13 * 4) - pRVar7[lVar17 * 0xf + 2];
                  error = dVar18 * dVar18 + dVar20 * dVar20 + dVar19 * dVar19;
                  if (error < 0.0) {
                    local_100 = (void *)*max_error_local;
                    dVar18 = sqrt(error);
                    pvVar9 = local_100;
                  }
                  else {
                    dVar18 = SQRT(error);
                    pvVar9 = (void *)*max_error_local;
                  }
                  if ((double)pvVar9 <= dVar18) {
                    if (error < 0.0) {
                      dVar18 = sqrt(error);
                    }
                    else {
                      dVar18 = SQRT(error);
                    }
                  }
                  else {
                    dVar18 = *max_error_local;
                  }
                  *max_error_local = dVar18;
                  lVar14 = lVar14 + 1;
                  lVar13 = lVar13 + 6;
                } while (lVar14 < n_recept);
              }
              if (recept_node != (REF_INT *)0x0) {
                free(recept_node);
              }
              if (recept_xyz != (REF_DBL *)0x0) {
                free(recept_xyz);
              }
              error = *max_error_local;
              uVar8 = ref_mpi_max(local_108,&error,max_error_local,3);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x9a3,"ref_interp_max_error",(ulong)uVar8,"max");
                return uVar8;
              }
              uVar8 = ref_mpi_bcast(local_108,&max_error_local,1,3);
              if (uVar8 == 0) {
                return 0;
              }
              pcVar15 = "max";
              uVar12 = 0x9a4;
            }
            else {
              pcVar15 = "blind send cell";
              uVar12 = 0x96c;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar12,"ref_interp_max_error",(ulong)uVar8,pcVar15);
            return uVar8;
          }
          pcVar15 = "malloc recept_proc of REF_INT NULL";
          uVar12 = 0x95a;
        }
      }
    }
  }
LAB_00173922:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12,
         "ref_interp_max_error",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,
                                        REF_DBL *max_error) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_CELL from_cell;
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL error;
  REF_INT i, j;
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_xyz, *donor_xyz, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *max_error = 0.0;

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_xyz, 3 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < 3; i++) {
      donor_xyz[i + 3 * donation] = 0.0;
      for (j = 0; j < ref_cell_node_per(from_cell); j++) {
        donor_xyz[i + 3 * donation] +=
            donor_bary[j + 4 * donation] * ref_node_xyz(from_node, i, nodes[j]);
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_xyz, 3, n_donor,
                        (void **)(&recept_xyz), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_xyz);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    error =
        pow(recept_xyz[0 + 3 * receptor] - ref_node_xyz(to_node, 0, node), 2) +
        pow(recept_xyz[1 + 3 * receptor] - ref_node_xyz(to_node, 1, node), 2) +
        pow(recept_xyz[2 + 3 * receptor] - ref_node_xyz(to_node, 2, node), 2);
    *max_error = MAX(*max_error, sqrt(error));
  }
  ref_free(recept_node);
  ref_free(recept_xyz);

  error = *max_error;
  RSS(ref_mpi_max(ref_mpi, &error, max_error, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &max_error, 1, REF_DBL_TYPE), "max");

  return REF_SUCCESS;
}